

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Not::Not(Not *this,shared_ptr<Token> *t,shared_ptr<Expr> *x2)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<Expr> local_58;
  shared_ptr<Expr> local_48;
  shared_ptr<Token> local_38;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  Logical::Logical(&this->super_Logical,&local_38,&local_48,&local_58);
  if (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_Logical).super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR_toJson_abi_cxx11__0012b1d0;
  peVar1 = (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68 = (peVar1->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60 = (peVar1->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  peVar1 = (x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78 = (peVar1->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70 = (peVar1->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_70->_M_use_count = local_70->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_70->_M_use_count = local_70->_M_use_count + 1;
    }
  }
  (*(this->super_Logical).super_Expr.super_Node._vptr_Node[7])(&local_28,this,&local_68,&local_78);
  p_Var3 = p_Stack_20;
  peVar2 = local_28;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_Logical).super_Expr.type.
            super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_Logical).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  (this->super_Logical).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

Not(std::shared_ptr<Token> t,  std::shared_ptr<Expr> x2) : Logical(t, x2, x2) {
		type = check(x2->type, x2->type);
	}